

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAds::testAdsWriteReqEx(TestAds *this,string *param_1)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  byte bVar4;
  int i;
  int iVar5;
  bool bVar6;
  uint32_t outBuffer;
  uint32_t buffer;
  string local_60;
  uint32_t bytesRead;
  uint32_t defaultValue;
  AmsAddr unknown;
  
  lVar1 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 != 0,&local_60,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x259);
  std::__cxx11::string::~string((string *)&local_60);
  print(&server,this->out);
  outBuffer = 0xdeadbeef;
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,4,&outBuffer);
    if ((lVar2 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_60,
                 "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x261);
      std::__cxx11::string::~string((string *)&local_60);
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar2 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,4,&buffer,&bytesRead);
    bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    if ((lVar2 != 0) != (bool)bVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_60,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x268);
      std::__cxx11::string::~string((string *)&local_60);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((bytesRead != 4) != (bool)(bVar4 & 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_60,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x269);
      std::__cxx11::string::~string((string *)&local_60);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((outBuffer != buffer) != (bool)(bVar4 & 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_60,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x26a);
      std::__cxx11::string::~string((string *)&local_60);
    }
    outBuffer = ~outBuffer;
  }
  lVar2 = AdsSyncWriteReqEx(0,(AmsAddr *)&server,0x4020,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x748,&local_60,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x270);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)0x0,0x4020,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x749,&local_60,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x274);
  std::__cxx11::string::~string((string *)&local_60);
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&unknown,0x4020,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 7,&local_60,
             "GLOBALERR_MISSING_ROUTE == AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x279);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,4,(void *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_60,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x27d);
  std::__cxx11::string::~string((string *)&local_60);
  outBuffer = 0xdeadbeef;
  buffer = 0;
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_60,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x282);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,0,&buffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_60,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x283);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0x4020,0,4,&buffer,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_60,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x284);
  std::__cxx11::string::~string((string *)&local_60);
  bVar6 = outBuffer == buffer;
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_60,"outBuffer == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x285);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0,0,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x701,&local_60,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x28d);
  std::__cxx11::string::~string((string *)&local_60);
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4025,0x10000,4,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x701,&local_60,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x291);
  std::__cxx11::string::~string((string *)&local_60);
  defaultValue = 0;
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0x4020,0,4,&defaultValue);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_60,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x294);
  std::__cxx11::string::~string((string *)&local_60);
  lVar1 = AdsPortCloseEx(lVar1);
  fructose::test_root::get_test_name_abi_cxx11_(&local_60,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_60,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x295);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void testAdsWriteReqEx(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        uint32_t bytesRead;
        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr));

        // provide 0 length writeBuffer
        outBuffer = 0xDEADBEEF;
        buffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer));
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(outBuffer == buffer);

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port,
                                                                      &server,
                                                                      0,
                                                                      0,
                                                                      sizeof(outBuffer),
                                                                      &outBuffer));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer));

        const uint32_t defaultValue = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue));
        fructose_assert(0 == AdsPortCloseEx(port));
    }